

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsort.scat.c
# Opt level: O2

void ga_sort_gath(Integer *pn,Integer *i,Integer *j,Integer *base)

{
  undefined8 uVar1;
  Integer IVar2;
  long *plVar3;
  ulong uVar4;
  ulong uVar5;
  long *plVar6;
  long lVar7;
  Integer *pIVar8;
  long lVar9;
  long *plVar10;
  long *plVar11;
  long lVar12;
  long lVar13;
  
  uVar5 = *pn;
  if (1 < (long)uVar5) {
    uVar4 = uVar5 >> 1;
    plVar3 = base + uVar4 * 2 + ((ulong)((uint)uVar5 & 1) - 1);
    for (; uVar4 != 1; uVar4 = uVar4 - 1) {
      uVar5 = uVar4;
      plVar6 = base + (uVar4 - 1);
      while (plVar11 = plVar6 + uVar5, plVar11 <= plVar3) {
        uVar5 = uVar5 * 2;
        if (plVar11 == plVar3) {
          lVar7 = *plVar3;
          plVar10 = plVar3;
        }
        else {
          lVar9 = *plVar11;
          lVar12 = plVar11[1];
          lVar7 = lVar9;
          if (lVar9 < lVar12) {
            lVar7 = lVar12;
          }
          plVar10 = plVar11 + 1;
          if (lVar12 <= lVar9) {
            plVar10 = plVar11;
          }
          uVar5 = uVar5 | lVar9 < lVar12;
        }
        lVar9 = *plVar6;
        if (lVar7 <= lVar9) break;
        lVar12 = (long)plVar10 - (long)base;
        *plVar6 = lVar7;
        lVar7 = (long)plVar6 - (long)base;
        *plVar10 = lVar9;
        uVar1 = *(undefined8 *)((long)i + lVar7);
        *(undefined8 *)((long)i + lVar7) = *(undefined8 *)((long)i + lVar12);
        *(undefined8 *)((long)i + lVar12) = uVar1;
        uVar1 = *(undefined8 *)((long)j + lVar7);
        *(undefined8 *)((long)j + lVar7) = *(undefined8 *)((long)j + lVar12);
        *(undefined8 *)((long)j + lVar12) = uVar1;
        plVar6 = plVar10;
      }
    }
    for (; lVar7 = (long)plVar3 - (long)base, lVar7 != 0; plVar3 = plVar3 + -1) {
      uVar5 = 1;
      pIVar8 = base;
      while (plVar6 = pIVar8 + uVar5, plVar6 <= plVar3) {
        uVar5 = uVar5 * 2;
        if (plVar6 == plVar3) {
          lVar9 = *plVar3;
          plVar11 = plVar3;
        }
        else {
          lVar12 = *plVar6;
          lVar13 = plVar6[1];
          lVar9 = lVar12;
          if (lVar12 < lVar13) {
            lVar9 = lVar13;
          }
          plVar11 = plVar6 + 1;
          if (lVar13 <= lVar12) {
            plVar11 = plVar6;
          }
          uVar5 = uVar5 | lVar12 < lVar13;
        }
        lVar12 = *pIVar8;
        if (lVar9 <= lVar12) break;
        lVar13 = (long)plVar11 - (long)base;
        *pIVar8 = lVar9;
        lVar9 = (long)pIVar8 - (long)base;
        *plVar11 = lVar12;
        uVar1 = *(undefined8 *)((long)i + lVar9);
        *(undefined8 *)((long)i + lVar9) = *(undefined8 *)((long)i + lVar13);
        *(undefined8 *)((long)i + lVar13) = uVar1;
        uVar1 = *(undefined8 *)((long)j + lVar9);
        *(undefined8 *)((long)j + lVar9) = *(undefined8 *)((long)j + lVar13);
        *(undefined8 *)((long)j + lVar13) = uVar1;
        pIVar8 = plVar11;
      }
      lVar9 = *base;
      *base = *plVar3;
      *plVar3 = lVar9;
      IVar2 = *i;
      *i = *(Integer *)((long)i + lVar7);
      *(Integer *)((long)i + lVar7) = IVar2;
      IVar2 = *j;
      *j = *(Integer *)((long)j + lVar7);
      *(Integer *)((long)j + lVar7) = IVar2;
    }
  }
  return;
}

Assistant:

void ga_sort_gath(pn, i, j, base)
     Integer *pn;
     Integer *i;
     Integer *j;
     Integer *base;
{

  if (*pn < 2) return;
  
#  undef SWAP  
#  define SWAP(a,b) { \
    Integer ltmp; \
    long ia = a - base; \
    long ib = b - base; \
    ltmp=*a; *a=*b; *b=ltmp; \
    ltmp=i[ia]; i[ia]=i[ib]; i[ib]=ltmp; \
    ltmp=j[ia]; j[ia]=j[ib]; j[ib]=ltmp; \
  }
  INDEX_SORT(base,pn,SWAP);
}